

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O3

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::render_hline
          (rasterizer_cells_aa<agg::cell_aa> *this,int ey,int x1,int y1,int x2,int y2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  cell_type *pcVar3;
  cell_type *pcVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  
  iVar15 = x2 >> 8;
  iVar5 = y2 - y1;
  if (iVar5 == 0) {
    if (((this->m_curr_cell).x == iVar15) && ((this->m_curr_cell).y == ey)) {
      return;
    }
    if ((this->m_curr_cell).cover != 0 || (this->m_curr_cell).area != 0) {
      if ((this->m_num_cells & 0xfff) == 0) {
        if (0x3ff < this->m_num_blocks) goto LAB_00112f50;
        allocate_block(this);
      }
      pcVar3 = this->m_curr_cell_ptr;
      this->m_curr_cell_ptr = pcVar3 + 1;
      iVar5 = (this->m_curr_cell).y;
      iVar12 = (this->m_curr_cell).cover;
      iVar14 = (this->m_curr_cell).area;
      pcVar3->x = (this->m_curr_cell).x;
      pcVar3->y = iVar5;
      pcVar3->cover = iVar12;
      pcVar3->area = iVar14;
      this->m_num_cells = this->m_num_cells + 1;
    }
LAB_00112f50:
    (this->m_curr_cell).x = iVar15;
    (this->m_curr_cell).y = ey;
    (this->m_curr_cell).cover = 0;
    (this->m_curr_cell).area = 0;
    return;
  }
  iVar12 = x1 >> 8;
  uVar8 = x1 & 0xff;
  if (iVar12 == iVar15) {
    uVar1 = (this->m_curr_cell).cover;
    uVar2 = (this->m_curr_cell).area;
    (this->m_curr_cell).cover = iVar5 + uVar1;
    (this->m_curr_cell).area = ((x2 & 0xffU) + uVar8) * iVar5 + uVar2;
    return;
  }
  lVar17 = (long)x2 - (long)x1;
  if (lVar17 < 0) {
    lVar17 = -lVar17;
    iVar14 = -1;
    uVar13 = 0;
    uVar6 = uVar8;
  }
  else {
    uVar13 = 0x100;
    iVar14 = 1;
    uVar6 = 0x100 - uVar8;
  }
  lVar10 = (long)(int)(uVar6 * iVar5) % lVar17;
  iVar20 = (int)(lVar10 >> 0x3f) + (int)((long)(int)(uVar6 * iVar5) / lVar17);
  iVar5 = (this->m_curr_cell).cover + iVar20;
  (this->m_curr_cell).cover = iVar5;
  iVar9 = (uVar8 | uVar13) * iVar20 + (this->m_curr_cell).area;
  (this->m_curr_cell).area = iVar9;
  iVar19 = iVar14 + iVar12;
  pcVar3 = &this->m_curr_cell;
  if (((this->m_curr_cell).x == iVar19) && ((this->m_curr_cell).y == ey)) goto LAB_0011308d;
  if (iVar9 != 0 || iVar5 != 0) {
    if ((this->m_num_cells & 0xfff) == 0) {
      if (0x3ff < this->m_num_blocks) goto LAB_00113082;
      allocate_block(this);
    }
    pcVar4 = this->m_curr_cell_ptr;
    this->m_curr_cell_ptr = pcVar4 + 1;
    iVar5 = pcVar3->y;
    iVar9 = (this->m_curr_cell).cover;
    iVar21 = (this->m_curr_cell).area;
    pcVar4->x = pcVar3->x;
    pcVar4->y = iVar5;
    pcVar4->cover = iVar9;
    pcVar4->area = iVar21;
    this->m_num_cells = this->m_num_cells + 1;
  }
LAB_00113082:
  (this->m_curr_cell).x = iVar19;
  (this->m_curr_cell).y = ey;
  iVar9 = 0;
  iVar5 = 0;
LAB_0011308d:
  iVar21 = y1 + iVar20;
  if (iVar19 != iVar15) {
    lVar7 = (long)(((iVar20 + y2) - iVar21) * 0x100);
    lVar11 = lVar7 % lVar17;
    uVar6 = (uint)(lVar11 >> 0x3f);
    uVar16 = (uint)lVar17;
    uVar8 = uVar16;
    if (lVar10 < 0) {
      uVar8 = 0;
    }
    iVar18 = (int)lVar10 - uVar8;
    iVar19 = iVar9;
    iVar20 = iVar5;
    do {
      iVar18 = iVar18 + (int)lVar11 + (uVar6 & uVar16);
      uVar8 = uVar16;
      if (-1 >= iVar18) {
        uVar8 = 0;
      }
      iVar5 = (uint)(-1 < iVar18) + (int)(lVar7 / lVar17) + uVar6;
      (this->m_curr_cell).cover = iVar20 + iVar5;
      iVar19 = iVar5 * 0x100 + iVar19;
      (this->m_curr_cell).area = iVar19;
      if (iVar19 != 0 || iVar20 + iVar5 != 0) {
        if ((this->m_num_cells & 0xfff) == 0) {
          if (0x3ff < this->m_num_blocks) goto LAB_00113175;
          allocate_block(this);
        }
        pcVar4 = this->m_curr_cell_ptr;
        this->m_curr_cell_ptr = pcVar4 + 1;
        iVar9 = pcVar3->y;
        iVar19 = (this->m_curr_cell).cover;
        iVar20 = (this->m_curr_cell).area;
        pcVar4->x = pcVar3->x;
        pcVar4->y = iVar9;
        pcVar4->cover = iVar19;
        pcVar4->area = iVar20;
        this->m_num_cells = this->m_num_cells + 1;
      }
LAB_00113175:
      iVar18 = iVar18 - uVar8;
      iVar21 = iVar21 + iVar5;
      (this->m_curr_cell).x = iVar14 * 2 + iVar12;
      (this->m_curr_cell).y = ey;
      (this->m_curr_cell).cover = 0;
      (this->m_curr_cell).area = 0;
      iVar12 = iVar12 + iVar14;
      iVar19 = 0;
      iVar9 = 0;
      iVar20 = 0;
      iVar5 = 0;
    } while (iVar15 - iVar14 != iVar12);
  }
  (this->m_curr_cell).cover = iVar5 + (y2 - iVar21);
  (this->m_curr_cell).area = ((x2 & 0xffU | 0x100) - uVar13) * (y2 - iVar21) + iVar9;
  return;
}

Assistant:

AGG_INLINE void rasterizer_cells_aa<Cell>::render_hline(int ey, 
                                                            int x1, int y1, 
                                                            int x2, int y2)
    {
        int ex1 = x1 >> poly_subpixel_shift;
        int ex2 = x2 >> poly_subpixel_shift;
        int fx1 = x1 & poly_subpixel_mask;
        int fx2 = x2 & poly_subpixel_mask;

        int delta, p, first;
        long long dx;
        int incr, lift, mod, rem;

        //trivial case. Happens often
        if(y1 == y2)
        {
            set_curr_cell(ex2, ey);
            return;
        }

        //everything is located in a single cell.  That is easy!
        if(ex1 == ex2)
        {
            delta = y2 - y1;
            m_curr_cell.cover += delta;
            m_curr_cell.area  += (fx1 + fx2) * delta;
            return;
        }

        //ok, we'll have to render a run of adjacent cells on the same
        //hline...
        p     = (poly_subpixel_scale - fx1) * (y2 - y1);
        first = poly_subpixel_scale;
        incr  = 1;

        dx = (long long)x2 - (long long)x1;

        if(dx < 0)
        {
            p     = fx1 * (y2 - y1);
            first = 0;
            incr  = -1;
            dx    = -dx;
        }

        delta = (int)(p / dx);
        mod   = (int)(p % dx);

        if(mod < 0)
        {
            delta--;
            mod += dx;
        }

        m_curr_cell.cover += delta;
        m_curr_cell.area  += (fx1 + first) * delta;

        ex1 += incr;
        set_curr_cell(ex1, ey);
        y1  += delta;

        if(ex1 != ex2)
        {
            p     = poly_subpixel_scale * (y2 - y1 + delta);
            lift  = (int)(p / dx);
            rem   = (int)(p % dx);

            if (rem < 0)
            {
                lift--;
                rem += dx;
            }

            mod -= dx;

            while (ex1 != ex2)
            {
                delta = lift;
                mod  += rem;
                if(mod >= 0)
                {
                    mod -= dx;
                    delta++;
                }

                m_curr_cell.cover += delta;
                m_curr_cell.area  += poly_subpixel_scale * delta;
                y1  += delta;
                ex1 += incr;
                set_curr_cell(ex1, ey);
            }
        }
        delta = y2 - y1;
        m_curr_cell.cover += delta;
        m_curr_cell.area  += (fx2 + poly_subpixel_scale - first) * delta;
    }